

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void getSystemBasePath(char *path,uint pathLength,uint *subLength)

{
  char *pcVar1;
  uchar uVar2;
  char *local_60;
  char *local_50;
  char *searchIter;
  char *resetSearchIter;
  char *iter;
  uchar systemPathLength;
  char *systemPath;
  int i;
  uint *subLength_local;
  uint pathLength_local;
  char *path_local;
  
  uVar2 = checkStringParameter(path,subLength);
  if (uVar2 != '\0') {
    for (systemPath._4_4_ = 0; systemPath._4_4_ < 8; systemPath._4_4_ = systemPath._4_4_ + 1) {
      pcVar1 = getSystemBasePath::systemPaths[systemPath._4_4_];
      resetSearchIter = path + pathLength;
      local_50 = pcVar1 + (long)(int)(uint)getSystemBasePath::systemPathLengths
                                           [systemPath._4_4_ >> 1] + -1;
      while (resetSearchIter = resetSearchIter + -1, pcVar1 <= local_50 && path <= resetSearchIter)
      {
        local_60 = pcVar1 + (long)(int)(uint)getSystemBasePath::systemPathLengths
                                             [systemPath._4_4_ >> 1] + -1;
        if (*resetSearchIter == *local_50) {
          local_60 = local_50 + -1;
        }
        local_50 = local_60;
      }
      if (local_50 < pcVar1) {
        *subLength = ((int)resetSearchIter - (int)path) +
                     (uint)getSystemBasePath::systemPathPrefixLength[systemPath._4_4_ >> 2] + 1;
        return;
      }
    }
    *subLength = 0;
  }
  return;
}

Assistant:

void getSystemBasePath(const char * path, unsigned int pathLength, unsigned int * subLength)
{
    static const char * systemPaths[] = {
        "/usr/bin/",
        "/usr/lib/",
        "/usr/lib32/",
        "/usr/lib64/",
        "/usr/local/bin/",
        "/usr/local/lib/",
        "/usr/local/lib32/",
        "/usr/local/lib64/",
    };
    static unsigned char systemPathLengths[] = { 9, 11, 15, 17 };
    static unsigned char systemPathPrefixLength[] = { 5, 11 };

    if (!checkStringParameter(path, subLength))
    {
        return;
    }

    for (int i = 0; i < 8; ++i)
    {
        const char * systemPath = systemPaths[i];
        unsigned char systemPathLength = systemPathLengths[i >> 1];

        const char * iter = path + pathLength - 1;
        const char * resetSearchIter = systemPath + systemPathLength - 1;
        const char * searchIter = resetSearchIter;
        while (searchIter >= systemPath && iter >= path)
        {
            searchIter = *iter == *searchIter ? searchIter - 1 : resetSearchIter;
            --iter;
        }

        if (searchIter < systemPath) // sub-systemPath-string found
        {
            *subLength = (unsigned int)(iter - path) + systemPathPrefixLength[i >> 2] + 1;
            return;
        }
    }

    *subLength = 0;
}